

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::~App(App *this)

{
  ~App(this);
  operator_delete(this,0x318);
  return;
}

Assistant:

virtual ~App() = default;